

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O2

pint p_uthread_join(PUThread *thread)

{
  pint pVar1;
  
  pVar1 = -1;
  if ((thread != (PUThread *)0x0) && ((thread->base).joinable != 0)) {
    p_uthread_wait_internal(thread);
    pVar1 = (thread->base).ret_code;
  }
  return pVar1;
}

Assistant:

P_LIB_API pint
p_uthread_join (PUThread *thread)
{
	const PUThreadBase *base_thread;

	if (P_UNLIKELY (thread == NULL))
		return -1;

	base_thread = (const PUThreadBase *) thread;

	if (base_thread->joinable == FALSE)
		return -1;

	p_uthread_wait_internal (thread);

	return base_thread->ret_code;
}